

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall QTextDocumentPrivate::aboutToRemoveCell(QTextDocumentPrivate *this,int from,int to)

{
  ulong uVar1;
  Data *pDVar2;
  ulong uVar3;
  
  pDVar2 = (this->cursors).q_hash.d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
    uVar3 = 0;
  }
  else {
    if (pDVar2->spans->offsets[0] != 0xff) {
      uVar3 = 0;
      goto LAB_004d4a47;
    }
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) {
        pDVar2 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar1 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  }
  if (pDVar2 == (Data *)0x0 && uVar3 == 0) {
    return;
  }
LAB_004d4a47:
  do {
    QTextCursorPrivate::aboutToRemoveCell
              (*(QTextCursorPrivate **)
                pDVar2->spans[uVar3 >> 7].entries
                [pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f]].storage.data,from,to);
    do {
      if (pDVar2->numBuckets - 1 == uVar3) {
        pDVar2 = (Data *)0x0;
        uVar3 = 0;
        break;
      }
      uVar3 = uVar3 + 1;
    } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
    if ((pDVar2 == (Data *)0x0) && (uVar3 == 0)) {
      return;
    }
  } while( true );
}

Assistant:

void QTextDocumentPrivate::aboutToRemoveCell(int from, int to)
{
    Q_ASSERT(from <= to);
    for (QTextCursorPrivate *curs : std::as_const(cursors))
        curs->aboutToRemoveCell(from, to);
}